

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getpart.c
# Opt level: O0

int readline(char **buffer,size_t *bufsize,FILE *stream)

{
  int __n;
  char *pcVar1;
  size_t sVar2;
  int bytestoread;
  size_t length;
  char *newptr;
  size_t offset;
  FILE *stream_local;
  size_t *bufsize_local;
  char **buffer_local;
  
  newptr = (char *)0x0;
  if (*buffer == (char *)0x0) {
    pcVar1 = (char *)(*Curl_cmalloc)(0x80);
    *buffer = pcVar1;
    if (*buffer == (char *)0x0) {
      return -1;
    }
    *bufsize = 0x80;
  }
  while( true ) {
    __n = curlx_uztosi(*bufsize - (long)newptr);
    pcVar1 = fgets(*buffer + (long)newptr,__n,(FILE *)stream);
    if (pcVar1 == (char *)0x0) {
      return (uint)(newptr == (char *)0x0);
    }
    sVar2 = strlen(*buffer + (long)newptr);
    newptr = newptr + sVar2;
    if ((*buffer + -1)[(long)newptr] == '\n') break;
    if ((char *)(*bufsize - 1) <= newptr) {
      pcVar1 = (char *)(*Curl_crealloc)(*buffer,*bufsize << 1);
      if (pcVar1 == (char *)0x0) {
        return -1;
      }
      *buffer = pcVar1;
      *bufsize = *bufsize << 1;
    }
  }
  return 0;
}

Assistant:

static int readline(char **buffer, size_t *bufsize, FILE *stream)
{
  size_t offset = 0;
  char *newptr;

  if(!*buffer) {
    *buffer = malloc(128);
    if(!*buffer)
      return GPE_OUT_OF_MEMORY;
    *bufsize = 128;
  }

  for(;;) {
    size_t length;
    int bytestoread = curlx_uztosi(*bufsize - offset);

    if(!fgets(*buffer + offset, bytestoread, stream))
      return (offset != 0) ? GPE_OK : GPE_END_OF_FILE;

    length = offset + strlen(*buffer + offset);
    if(*(*buffer + length - 1) == '\n')
      break;
    offset = length;
    if(length < *bufsize - 1)
      continue;

    newptr = realloc(*buffer, *bufsize * 2);
    if(!newptr)
      return GPE_OUT_OF_MEMORY;
    *buffer = newptr;
    *bufsize *= 2;
  }

  return GPE_OK;
}